

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O3

void noise_get_heavy(_func_void_void_ptr_int *func)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  FILE *__stream;
  size_t sVar5;
  FILE *pFVar6;
  uint uVar7;
  char buf [512];
  undefined1 auStack_4d0 [520];
  rusage rStack_2c8;
  _func_void_void_ptr_int *p_Stack_238;
  FILE *pFStack_230;
  undefined1 local_228 [520];
  
  pFVar6 = (FILE *)0x0;
  pFStack_230 = (FILE *)0x12af47;
  iVar2 = open("/dev/urandom",0);
  if (iVar2 < 0) {
LAB_0012afac:
    pFStack_230 = (FILE *)0x12afbf;
    __stream = popen("ps -axu 2>/dev/null","r");
    if (__stream == (FILE *)0x0) {
      pFStack_230 = (FILE *)0x12b0ac;
      noise_get_heavy_cold_2();
      goto LAB_0012b0ac;
    }
    bVar1 = false;
LAB_0012afcd:
    pFStack_230 = (FILE *)0x12afe2;
    sVar5 = fread(local_228,1,0x200,__stream);
    iVar2 = (int)sVar5;
    while (0 < iVar2) {
      pFStack_230 = (FILE *)0x12aff0;
      (*func)(local_228,(int)sVar5);
      pFStack_230 = (FILE *)0x12b005;
      sVar5 = fread(local_228,1,0x200,__stream);
      iVar2 = (int)sVar5;
    }
    pFStack_230 = (FILE *)0x12b011;
    pclose(__stream);
    pFStack_230 = (FILE *)0x12b024;
    pFVar6 = popen("ls -al /tmp 2>/dev/null","r");
    if (pFVar6 == (FILE *)0x0) {
      pFVar6 = __stream;
      if (!bVar1) {
LAB_0012b0ac:
        pFStack_230 = (FILE *)noise_regular;
        noise_get_heavy_cold_1();
        p_Stack_238 = func;
        pFStack_230 = pFVar6;
        iVar2 = open("/proc/meminfo",0);
        if (-1 < iVar2) {
          sVar4 = read(iVar2,auStack_4d0,0x200);
          iVar3 = (int)sVar4;
          while (0 < iVar3) {
            random_add_noise(NOISE_SOURCE_MEMINFO,auStack_4d0,(int)sVar4);
            sVar4 = read(iVar2,auStack_4d0,0x200);
            iVar3 = (int)sVar4;
          }
          close(iVar2);
        }
        iVar2 = open("/proc/stat",0);
        if (-1 < iVar2) {
          sVar4 = read(iVar2,auStack_4d0,0x200);
          iVar3 = (int)sVar4;
          while (0 < iVar3) {
            random_add_noise(NOISE_SOURCE_STAT,auStack_4d0,(int)sVar4);
            sVar4 = read(iVar2,auStack_4d0,0x200);
            iVar3 = (int)sVar4;
          }
          close(iVar2);
        }
        getrusage(RUSAGE_SELF,&rStack_2c8);
        random_add_noise(NOISE_SOURCE_RUSAGE,&rStack_2c8,0x90);
        return;
      }
      goto LAB_0012b077;
    }
  }
  else {
    do {
      pFStack_230 = (FILE *)0x12af63;
      sVar4 = read(iVar2,local_228 + (long)pFVar6,(ulong)(0x20 - (int)pFVar6));
      if ((int)sVar4 < 0) {
        pFStack_230 = (FILE *)0x12afac;
        close(iVar2);
        goto LAB_0012afac;
      }
      uVar7 = (int)pFVar6 + (int)sVar4;
      pFVar6 = (FILE *)(ulong)uVar7;
    } while ((int)uVar7 < 0x20);
    pFStack_230 = (FILE *)0x12af77;
    close(iVar2);
    pFStack_230 = (FILE *)0x12af81;
    (*func)(local_228,0x20);
    pFStack_230 = (FILE *)0x12af94;
    __stream = popen("ps -axu 2>/dev/null","r");
    if (__stream != (FILE *)0x0) {
      bVar1 = true;
      goto LAB_0012afcd;
    }
    pFStack_230 = (FILE *)0x12b0a0;
    pFVar6 = popen("ls -al /tmp 2>/dev/null","r");
    if (pFVar6 == (FILE *)0x0) goto LAB_0012b077;
  }
  pFStack_230 = (FILE *)0x12b041;
  sVar5 = fread(local_228,1,0x200,pFVar6);
  iVar2 = (int)sVar5;
  while (0 < iVar2) {
    pFStack_230 = (FILE *)0x12b04f;
    (*func)(local_228,(int)sVar5);
    pFStack_230 = (FILE *)0x12b064;
    sVar5 = fread(local_228,1,0x200,pFVar6);
    iVar2 = (int)sVar5;
  }
  pFStack_230 = (FILE *)0x12b070;
  pclose(pFVar6);
LAB_0012b077:
  pFStack_230 = (FILE *)0x12b07f;
  read_random_seed(func);
  return;
}

Assistant:

void noise_get_heavy(void (*func) (void *, int))
{
    char buf[512];
    FILE *fp;
    int ret;
    bool got_dev_urandom = false;

    if (read_dev_urandom(buf, 32)) {
        got_dev_urandom = true;
        func(buf, 32);
    }

    fp = popen("ps -axu 2>/dev/null", "r");
    if (fp) {
        while ( (ret = fread(buf, 1, sizeof(buf), fp)) > 0)
            func(buf, ret);
        pclose(fp);
    } else if (!got_dev_urandom) {
        fprintf(stderr, "popen: %s\n"
                "Unable to access fallback entropy source\n", strerror(errno));
        exit(1);
    }

    fp = popen("ls -al /tmp 2>/dev/null", "r");
    if (fp) {
        while ( (ret = fread(buf, 1, sizeof(buf), fp)) > 0)
            func(buf, ret);
        pclose(fp);
    } else if (!got_dev_urandom) {
        fprintf(stderr, "popen: %s\n"
                "Unable to access fallback entropy source\n", strerror(errno));
        exit(1);
    }

    read_random_seed(func);
}